

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

bool __thiscall cmSourceFile::TryFullPath(cmSourceFile *this,string *path,string *ext)

{
  bool bVar1;
  ulong uVar2;
  char *filename;
  string local_48 [8];
  string tryPath;
  string *ext_local;
  string *path_local;
  cmSourceFile *this_local;
  
  tryPath.field_2._8_8_ = ext;
  std::__cxx11::string::string(local_48,(string *)path);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator+=(local_48,".");
    std::__cxx11::string::operator+=(local_48,(string *)tryPath.field_2._8_8_);
  }
  filename = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(filename);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&this->FullPath,local_48);
  }
  std::__cxx11::string::~string(local_48);
  return bVar1;
}

Assistant:

bool cmSourceFile::TryFullPath(const std::string& path,
                               const std::string& ext)
{
  std::string tryPath = path;
  if(!ext.empty())
    {
    tryPath += ".";
    tryPath += ext;
    }
  if(cmSystemTools::FileExists(tryPath.c_str()))
    {
    this->FullPath = tryPath;
    return true;
    }
  return false;
}